

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O2

void __thiscall
icu_63::SimpleTimeZone::setEndRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,int32_t time,
          TimeMode mode,UBool after,UErrorCode *status)

{
  if (after == '\0') {
    dayOfMonth = -dayOfMonth;
  }
  setEndRule(this,month,dayOfMonth,-dayOfWeek,time,mode,status);
  return;
}

Assistant:

void 
SimpleTimeZone::setEndRule(int32_t month, int32_t dayOfMonth, int32_t dayOfWeek, 
                           int32_t time, TimeMode mode, UBool after, UErrorCode& status)
{
    setEndRule(month, after ? dayOfMonth : -dayOfMonth,
               -dayOfWeek, time, mode, status);
}